

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_4_channels_with_n_coeffs_mod3
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  float *pfVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar17 = horizontal_coefficients + 4;
  do {
    lVar18 = (long)(horizontal_contributors->n0 * 4);
    pfVar14 = decode_buffer + lVar18;
    fVar21 = *horizontal_coefficients;
    fVar24 = horizontal_coefficients[1];
    fVar22 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar25 = fVar22 * pfVar14[8] + *pfVar14 * fVar21;
    fVar26 = fVar22 * pfVar14[9] + pfVar14[1] * fVar21;
    fVar27 = fVar22 * pfVar14[10] + pfVar14[2] * fVar21;
    fVar28 = fVar22 * pfVar14[0xb] + pfVar14[3] * fVar21;
    fVar21 = fVar2 * pfVar14[0xc] + fVar24 * pfVar14[4];
    fVar22 = fVar2 * pfVar14[0xd] + fVar24 * pfVar14[5];
    fVar23 = fVar2 * pfVar14[0xe] + fVar24 * pfVar14[6];
    fVar24 = fVar2 * pfVar14[0xf] + fVar24 * pfVar14[7];
    iVar16 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -3 >> 2) + 1;
    pfVar14 = decode_buffer + lVar18 + 0x10;
    pfVar15 = pfVar17;
    do {
      pfVar20 = pfVar15;
      pfVar19 = pfVar14;
      fVar2 = *pfVar20;
      fVar3 = pfVar20[1];
      fVar4 = pfVar20[2];
      fVar5 = pfVar20[3];
      fVar25 = fVar4 * pfVar19[8] + *pfVar19 * fVar2 + fVar25;
      fVar26 = fVar4 * pfVar19[9] + pfVar19[1] * fVar2 + fVar26;
      fVar27 = fVar4 * pfVar19[10] + pfVar19[2] * fVar2 + fVar27;
      fVar28 = fVar4 * pfVar19[0xb] + pfVar19[3] * fVar2 + fVar28;
      fVar21 = fVar5 * pfVar19[0xc] + fVar3 * pfVar19[4] + fVar21;
      fVar22 = fVar5 * pfVar19[0xd] + fVar3 * pfVar19[5] + fVar22;
      fVar23 = fVar5 * pfVar19[0xe] + fVar3 * pfVar19[6] + fVar23;
      fVar24 = fVar5 * pfVar19[0xf] + fVar3 * pfVar19[7] + fVar24;
      iVar16 = iVar16 + -1;
      pfVar14 = pfVar19 + 0x10;
      pfVar15 = pfVar20 + 4;
    } while (1 < iVar16);
    fVar2 = pfVar20[4];
    fVar3 = pfVar20[5];
    fVar4 = pfVar20[6];
    fVar5 = pfVar19[0x11];
    fVar6 = pfVar19[0x12];
    fVar7 = pfVar19[0x13];
    fVar8 = pfVar19[0x15];
    fVar9 = pfVar19[0x16];
    fVar10 = pfVar19[0x17];
    fVar11 = pfVar19[0x19];
    fVar12 = pfVar19[0x1a];
    fVar13 = pfVar19[0x1b];
    *output_buffer =
         fVar4 * pfVar19[0x18] + fVar25 + pfVar19[0x10] * fVar2 + fVar21 + fVar3 * pfVar19[0x14];
    output_buffer[1] = fVar4 * fVar11 + fVar26 + fVar5 * fVar2 + fVar22 + fVar3 * fVar8;
    output_buffer[2] = fVar4 * fVar12 + fVar27 + fVar6 * fVar2 + fVar23 + fVar3 * fVar9;
    output_buffer[3] = fVar4 * fVar13 + fVar28 + fVar7 * fVar2 + fVar24 + fVar3 * fVar10;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar17 = pfVar17 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod3 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 7 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__3_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}